

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

void __thiscall OpenMD::ZConstraintForceModifier::modifyForces(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *fixedZmols;
  bool bVar1;
  _List_node_base *p_Var2;
  RealType RVar3;
  Vector3d com;
  Vector<double,_3U> VStack_58;
  Vector<double,_3U> local_40;
  
  this->currSnapshot_ = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
  if (this->usingZconsGap_ == true) {
    updateZPos(this);
  }
  bVar1 = checkZConsState(this);
  if (bVar1) {
    calcTotalMassMovingZMols(this);
    zeroVelocity(this);
  }
  fixedZmols = &this->fixedZMols_;
  if ((this->fixedZMols_).
      super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)fixedZmols) {
    doZconstraintForce(this);
  }
  if ((this->movingZMols_).
      super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&this->movingZMols_) {
    doHarmonic(this);
  }
  RVar3 = Snapshot::getTime(this->currSnapshot_);
  if (this->currZconsTime_ <= RVar3) {
    Vector<double,_3U>::Vector(&VStack_58);
    p_Var2 = (_List_node_base *)fixedZmols;
    while (p_Var2 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *
                      )&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)fixedZmols) {
      Molecule::getCom((Vector3d *)&local_40,(Molecule *)p_Var2[1]._M_next);
      Vector<double,_3U>::operator=(&VStack_58,&local_40);
      p_Var2[3]._M_prev = (_List_node_base *)VStack_58.data_[2];
    }
    ZConsWriter::writeFZ(this->fzOut,fixedZmols);
    this->currZconsTime_ = this->zconsTime_ + this->currZconsTime_;
  }
  return;
}

Assistant:

void ZConstraintForceModifier::modifyForces() {
    currSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    if (usingZconsGap_) { updateZPos(); }

    if (checkZConsState()) {
      calcTotalMassMovingZMols();
      zeroVelocity();
    }

    // do zconstraint force;
    if (haveFixedZMols()) { doZconstraintForce(); }

    // use external force to move the molecules to the specified positions
    if (haveMovingZMols()) { doHarmonic(); }

    // write out forces and current positions of z-constraint molecules
    if (currSnapshot_->getTime() >= currZconsTime_) {
      std::list<ZconstraintMol>::iterator i;
      Vector3d com;
      for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
        com     = i->mol->getCom();
        i->zpos = com[whichDirection];
      }

      fzOut->writeFZ(fixedZMols_);
      currZconsTime_ += zconsTime_;
    }
  }